

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O3

void __thiscall Measurement_powroot_Test::TestBody(Measurement_powroot_Test *this)

{
  bool bVar1;
  unit_data extraout_EAX;
  unit_data extraout_EAX_00;
  unit_data extraout_EAX_01;
  unit extraout_RAX;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  double in_XMM0_Qa;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double in_XMM1_Qa;
  double extraout_XMM1_Qa;
  double extraout_XMM1_Qa_00;
  double extraout_XMM1_Qa_01;
  double extraout_XMM1_Qa_02;
  double extraout_XMM1_Qa_03;
  double extraout_XMM1_Qa_04;
  measurement mVar3;
  AssertionResult gtest_ar;
  measurement m2;
  measurement v1;
  measurement m1;
  AssertHelper AStack_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  undefined1 local_a8 [8];
  unit local_a0;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  measurement local_78;
  undefined1 local_68 [8];
  unit local_60;
  float local_54;
  measurement local_50;
  measurement local_40;
  measurement local_30;
  
  local_50.units_ = (unit)local_50.value_;
  local_30.value_ = 2.0;
  local_30.units_ = (unit)&DAT_13f800000;
  local_40.value_ = units::pow(in_XMM0_Qa,in_XMM1_Qa);
  local_50.value_ = local_40.value_;
  local_68._0_4_ = 0.0;
  local_68._4_4_ = (unit_data)0x40200000;
  local_40.units_ = extraout_RAX;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_98,"v1.value()","8.0",&local_50.value_,(double *)local_68);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xa5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((long *)local_50.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_50.value_ + 8))();
      in_XMM1_Qa = extraout_XMM1_Qa;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_50.value_ = (double)local_40.units_;
  local_54 = units::detail::power_const<float>(1.0,3);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::m + 4),(double)CONCAT44(extraout_XMM0_Db,local_54),
             in_XMM1_Qa);
  local_68._4_4_ = extraout_EAX;
  local_68._0_4_ = local_54;
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            ((internal *)local_98,"v1.units()","m.pow(3)",(unit *)&local_50,(unit *)local_68);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
    if ((long *)local_50.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_50.value_ + 8))();
      in_XMM1_Qa = extraout_XMM1_Qa_00;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_50 = units::root(&local_40,3);
  bVar1 = units::measurement::operator==(&local_50,&local_30);
  local_68[0] = bVar1;
  local_60.multiplier_ = 0.0;
  local_60.base_units_ = (unit_data)0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_68,(AssertionResult *)"m2 == m1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xa9,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
    }
    if ((long *)local_78.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.value_ + 8))();
      in_XMM1_Qa = extraout_XMM1_Qa_01;
    }
    if (local_60 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    }
  }
  mVar3 = units::root(&local_40,0);
  local_68 = (undefined1  [8])mVar3.value_;
  local_78.value_ = 1.0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_98,"m0.value()","1.0",(double *)local_68,&local_78.value_);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((unit)local_68 != (unit)0x0) {
      (**(code **)(*(long *)local_68 + 8))();
      in_XMM1_Qa = extraout_XMM1_Qa_02;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_68 = (undefined1  [8])mVar3.units_;
  testing::internal::CmpHelperEQ<units::unit,units::unit>
            ((internal *)local_98,"m0.units()","one",(unit *)local_68,(unit *)&units::one);
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_68);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((unit)local_68 != (unit)0x0) {
      (**(code **)(*(long *)local_68 + 8))();
      in_XMM1_Qa = extraout_XMM1_Qa_03;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_54 = units::detail::power_const<float>(1.0,2);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::m + 4),(double)CONCAT44(extraout_XMM0_Db_00,local_54),
             in_XMM1_Qa);
  local_68._0_4_ = 0.0;
  local_68._4_4_ = (unit_data)0x40300000;
  local_60.base_units_ = extraout_EAX_00;
  local_60.multiplier_ = local_54;
  local_78 = units::root((measurement *)local_68,2);
  local_a8[0] = (internal)0x0;
  local_a8._1_7_ = 0x40100000000000;
  local_a0 = (unit)&DAT_13f800000;
  testing::internal::CmpHelperEQ<units::measurement,units::measurement>
            ((internal *)local_98,"sqrt(m4)","measurement(4.0, m)",&local_78,(measurement *)local_a8
            );
  if (local_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
    if ((long *)local_78.value_ != (long *)0x0) {
      (**(code **)(*(long *)local_78.value_ + 8))();
      in_XMM1_Qa = extraout_XMM1_Qa_04;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_54 = units::detail::power_const<float>(1.0,6);
  units::detail::unit_data::pow
            ((unit_data *)((long)&units::m + 4),(double)CONCAT44(extraout_XMM0_Db_01,local_54),
             in_XMM1_Qa);
  local_78.units_.multiplier_ = local_54;
  local_78.value_ = -0.25;
  local_78.units_.base_units_ = extraout_EAX_01;
  mVar3 = units::root(&local_78,2);
  if (((((ulong)mVar3.units_ >> 0x20 != 0xfa94a488) || (!NAN(mVar3.units_.multiplier_))) &&
      (mVar3.units_.base_units_ != (unit_data)0xfa94a488)) && (!NAN(mVar3.units_.multiplier_))) {
    local_a8[0] = (internal)NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (!(bool)local_a8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_a8,
                 (AssertionResult *)"is_valid(root(mneg, 2))","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
                 ,0xb3,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_a0 != (unit)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      }
    }
  }
  mVar3 = units::root(&local_78,-2);
  if ((((ulong)mVar3.units_ >> 0x20 != 0xfa94a488) || (!NAN(mVar3.units_.multiplier_))) &&
     ((mVar3.units_.base_units_ != (unit_data)0xfa94a488 && (!NAN(mVar3.units_.multiplier_))))) {
    local_a8[0] = (internal)NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (!(bool)local_a8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_a8,
                 (AssertionResult *)"is_valid(root(mneg, -2))","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
                 ,0xb4,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_a0 != (unit)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      }
    }
  }
  mVar3 = units::root(&local_78,4);
  if ((((ulong)mVar3.units_ >> 0x20 != 0xfa94a488) || (!NAN(mVar3.units_.multiplier_))) &&
     ((mVar3.units_.base_units_ != (unit_data)0xfa94a488 && (!NAN(mVar3.units_.multiplier_))))) {
    local_a8[0] = (internal)NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (!(bool)local_a8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_a8,
                 (AssertionResult *)"is_valid(root(mneg, 4))","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
                 ,0xb5,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_a0 != (unit)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      }
    }
  }
  mVar3 = units::root(&local_78,-4);
  if (((((ulong)mVar3.units_ >> 0x20 != 0xfa94a488) || (!NAN(mVar3.units_.multiplier_))) &&
      (mVar3.units_.base_units_ != (unit_data)0xfa94a488)) && (!NAN(mVar3.units_.multiplier_))) {
    local_a8[0] = (internal)NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (!(bool)local_a8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_a8,
                 (AssertionResult *)"is_valid(root(mneg, -4))","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
                 ,0xb6,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_a0 != (unit)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      }
    }
  }
  mVar3 = units::root(&local_78,6);
  if ((((ulong)mVar3.units_ >> 0x20 != 0xfa94a488) || (!NAN(mVar3.units_.multiplier_))) &&
     ((mVar3.units_.base_units_ != (unit_data)0xfa94a488 && (!NAN(mVar3.units_.multiplier_))))) {
    local_a8[0] = (internal)NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (!(bool)local_a8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_a8,
                 (AssertionResult *)"is_valid(root(mneg, 6))","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
                 ,0xb7,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_a0 != (unit)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      }
    }
  }
  mVar3 = units::root(&local_78,-6);
  if ((((ulong)mVar3.units_ >> 0x20 != 0xfa94a488) || (!NAN(mVar3.units_.multiplier_))) &&
     ((mVar3.units_.base_units_ != (unit_data)0xfa94a488 && (!NAN(mVar3.units_.multiplier_))))) {
    local_a8[0] = (internal)NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (!(bool)local_a8[0]) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_a8,
                 (AssertionResult *)"is_valid(root(mneg, -6))","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
                 ,0xb8,(char *)CONCAT71(local_98._1_7_,local_98[0]));
      testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
      }
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
      if (local_a0 != (unit)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
      }
    }
  }
  mVar3 = units::root(&local_78,0);
  if (((((ulong)mVar3.units_ >> 0x20 == 0xfa94a488) && (NAN(mVar3.units_.multiplier_))) ||
      (mVar3.units_.base_units_ == (unit_data)0xfa94a488)) || (NAN(mVar3.units_.multiplier_))) {
    local_a8[0] = (internal)0x0;
LAB_00131cf8:
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_a8,(AssertionResult *)"is_valid(root(mneg, 0))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xb9,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
    if (local_a0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_a8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    }
  }
  else {
    local_a8[0] = (internal)!NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (NAN(mVar3.value_)) goto LAB_00131cf8;
  }
  mVar3 = units::root(&local_78,1);
  if ((((ulong)mVar3.units_ >> 0x20 == 0xfa94a488) && (NAN(mVar3.units_.multiplier_))) ||
     ((mVar3.units_.base_units_ == (unit_data)0xfa94a488 || (NAN(mVar3.units_.multiplier_))))) {
    local_a8[0] = (internal)0x0;
LAB_00131dfc:
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_a8,(AssertionResult *)"is_valid(root(mneg, 1))",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xba,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
    if (local_a0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_a8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    }
  }
  else {
    local_a8[0] = (internal)!NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (NAN(mVar3.value_)) goto LAB_00131dfc;
  }
  mVar3 = units::root(&local_78,-1);
  if ((((ulong)mVar3.units_ >> 0x20 == 0xfa94a488) && (NAN(mVar3.units_.multiplier_))) ||
     ((mVar3.units_.base_units_ == (unit_data)0xfa94a488 || (NAN(mVar3.units_.multiplier_))))) {
    local_a8[0] = (internal)0x0;
LAB_00131f00:
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)local_a8,(AssertionResult *)"is_valid(root(mneg, -1))"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0xbb,(char *)CONCAT71(local_98._1_7_,local_98[0]));
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
    if (local_a0 != (unit)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_a8 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    }
  }
  else {
    local_a8[0] = (internal)!NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (NAN(mVar3.value_)) goto LAB_00131f00;
  }
  mVar3 = units::root(&local_78,3);
  if (((((ulong)mVar3.units_ >> 0x20 == 0xfa94a488) && (NAN(mVar3.units_.multiplier_))) ||
      (mVar3.units_.base_units_ == (unit_data)0xfa94a488)) || (NAN(mVar3.units_.multiplier_))) {
    local_a8[0] = (internal)0x0;
  }
  else {
    local_a8[0] = (internal)!NAN(mVar3.value_);
    local_a0.multiplier_ = 0.0;
    local_a0.base_units_ = (unit_data)0x0;
    if (!NAN(mVar3.value_)) goto LAB_001320ce;
  }
  local_a0.multiplier_ = 0.0;
  local_a0.base_units_ = (unit_data)0x0;
  testing::Message::Message((Message *)&local_b0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_98,(internal *)local_a8,(AssertionResult *)"is_valid(root(mneg, 3))",
             "false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
             ,0xbc,(char *)CONCAT71(local_98._1_7_,local_98[0]));
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
  }
  if (local_b0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b0._M_head_impl + 8))();
  }
  if (local_a0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  }
LAB_001320ce:
  mVar3 = units::root(&local_78,-3);
  if ((((ulong)mVar3.units_ >> 0x20 == 0xfa94a488) && (NAN(mVar3.units_.multiplier_))) ||
     ((mVar3.units_.base_units_ == (unit_data)0xfa94a488 || (NAN(mVar3.units_.multiplier_))))) {
    local_a8 = (undefined1  [8])((ulong)(uint7)local_a8._1_7_ << 8);
  }
  else {
    local_a8[0] = (internal)!NAN(mVar3.value_);
    if (!NAN(mVar3.value_)) {
      return;
    }
  }
  local_a0.multiplier_ = 0.0;
  local_a0.base_units_ = (unit_data)0x0;
  testing::Message::Message((Message *)&local_b0);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_98,(internal *)local_a8,(AssertionResult *)"is_valid(root(mneg, -3))",
             "false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
             ,0xbd,(char *)CONCAT71(local_98._1_7_,local_98[0]));
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._1_7_,local_98[0]) != &local_88) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_98._1_7_,local_98[0]),local_88._M_allocated_capacity + 1);
  }
  if (local_b0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b0._M_head_impl + 8))();
  }
  if (local_a0 != (unit)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_a8 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  }
  return;
}

Assistant:

TEST(Measurement, powroot)
{
    measurement m1(2.0, m);

    auto v1 = pow(m1, 3);
    EXPECT_EQ(v1.value(), 8.0);
    EXPECT_EQ(v1.units(), m.pow(3));
#ifndef UNITS_HEADER_ONLY
    auto m2 = root(v1, 3);
    EXPECT_TRUE(m2 == m1);

    auto m0 = root(v1, 0);
    EXPECT_EQ(m0.value(), 1.0);
    EXPECT_EQ(m0.units(), one);

    measurement m4(16.0, m.pow(2));
    EXPECT_EQ(sqrt(m4), measurement(4.0, m));

    measurement mneg(-0.25, m.pow(6));
    EXPECT_FALSE(is_valid(root(mneg, 2)));
    EXPECT_FALSE(is_valid(root(mneg, -2)));
    EXPECT_FALSE(is_valid(root(mneg, 4)));
    EXPECT_FALSE(is_valid(root(mneg, -4)));
    EXPECT_FALSE(is_valid(root(mneg, 6)));
    EXPECT_FALSE(is_valid(root(mneg, -6)));
    EXPECT_TRUE(is_valid(root(mneg, 0)));
    EXPECT_TRUE(is_valid(root(mneg, 1)));
    EXPECT_TRUE(is_valid(root(mneg, -1)));
    EXPECT_TRUE(is_valid(root(mneg, 3)));
    EXPECT_TRUE(is_valid(root(mneg, -3)));
#endif
}